

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O2

STRING_HANDLE STRING_construct_sprintf(char *format,...)

{
  char in_AL;
  int iVar1;
  STRING_HANDLE pSVar2;
  char *pcVar3;
  LOGGER_LOG p_Var4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg_list;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (format == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (STRING_HANDLE)0x0;
    }
    pcVar3 = "Failure: invalid argument.";
    iVar1 = 0xbe;
  }
  else {
    arg_list[0].reg_save_area = local_e8;
    arg_list[0].gp_offset = 8;
    arg_list[0].fp_offset = 0x30;
    arg_list[0].overflow_arg_area = &stack0x00000008;
    iVar1 = vsnprintf((char *)0x0,0,format,arg_list);
    if (iVar1 < 1) {
      if (iVar1 == 0) {
        pSVar2 = STRING_new();
        return pSVar2;
      }
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) {
        return (STRING_HANDLE)0x0;
      }
      pcVar3 = "Failure: vsnprintf return 0 length";
      iVar1 = 0xb9;
    }
    else {
      pSVar2 = (STRING_HANDLE)malloc(8);
      if (pSVar2 == (STRING_HANDLE)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 == (LOGGER_LOG)0x0) {
          return (STRING_HANDLE)0x0;
        }
        pcVar3 = "Failure: allocation failed.";
        iVar1 = 0xae;
      }
      else {
        pcVar3 = (char *)malloc((ulong)(iVar1 + 1));
        pSVar2->s = pcVar3;
        if (pcVar3 == (char *)0x0) {
          free(pSVar2);
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) {
            return (STRING_HANDLE)0x0;
          }
          pcVar3 = "Failure: allocation sprintf value failed. size=%zu";
          iVar1 = 0xa9;
        }
        else {
          arg_list[0].reg_save_area = local_e8;
          arg_list[0].gp_offset = 8;
          arg_list[0].fp_offset = 0x30;
          arg_list[0].overflow_arg_area = &stack0x00000008;
          iVar1 = vsnprintf(pcVar3,(ulong)(iVar1 + 1),format,arg_list);
          if (-1 < iVar1) {
            return pSVar2;
          }
          free(pcVar3);
          free(pSVar2);
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) {
            return (STRING_HANDLE)0x0;
          }
          pcVar3 = "Failure: vsnprintf formatting failed.";
          iVar1 = 0xa0;
        }
      }
    }
  }
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/strings.c"
            ,"STRING_construct_sprintf",iVar1,1,pcVar3);
  return (STRING_HANDLE)0x0;
}

Assistant:

__attribute__((format(printf, 1, 2)))
#endif
STRING_HANDLE STRING_construct_sprintf(const char* format, ...)
{
    STRING* result;

#ifdef STRINGS_C_SPRINTF_BUFFER_SIZE
    size_t maxBufSize = STRINGS_C_SPRINTF_BUFFER_SIZE;
    char buf[STRINGS_C_SPRINTF_BUFFER_SIZE];
#else
    size_t maxBufSize = 0;
    char* buf = NULL;
#endif

    if (format != NULL)
    {
        va_list arg_list;
        int length;
        va_start(arg_list, format);

        /* Codes_SRS_STRING_07_041: [STRING_construct_sprintf shall determine the size of the resulting string and allocate the necessary memory.] */
        length = vsnprintf(buf, maxBufSize, format, arg_list);
        va_end(arg_list);
        if (length > 0)
        {
            result = (STRING*)malloc(sizeof(STRING));
            if (result != NULL)
            {
                size_t malloc_size = safe_add_size_t((size_t)length, 1);
                if (malloc_size != SIZE_MAX && (result->s = (char*)malloc(malloc_size)) != NULL)
                {
                    va_start(arg_list, format);
                    if (vsnprintf(result->s, malloc_size, format, arg_list) < 0)
                    {
                        /* Codes_SRS_STRING_07_040: [If any error is encountered STRING_construct_sprintf shall return NULL.] */
                        free(result->s);
                        free(result);
                        result = NULL;
                        LogError("Failure: vsnprintf formatting failed.");
                    }
                    va_end(arg_list);
                }
                else
                {
                    /* Codes_SRS_STRING_07_040: [If any error is encountered STRING_construct_sprintf shall return NULL.] */
                    free(result);
                    result = NULL;
                    LogError("Failure: allocation sprintf value failed. size=%zu", malloc_size);
                }
            }
            else
            {
                LogError("Failure: allocation failed.");
            }
        }
        else if (length == 0)
        {
            result = (STRING*)STRING_new();
        }
        else
        {
            /* Codes_SRS_STRING_07_039: [If the parameter format is NULL then STRING_construct_sprintf shall return NULL.] */
            result = NULL;
            LogError("Failure: vsnprintf return 0 length");
        }
    }
    else
    {
        LogError("Failure: invalid argument.");
        result = NULL;
    }
    /* Codes_SRS_STRING_07_045: [STRING_construct_sprintf shall allocate a new string with the value of the specified printf formated const char. ] */
    return (STRING_HANDLE)result;
}